

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonTranslateTextToBlob(JsonParse *pParse,u32 i)

{
  byte *__s1;
  byte bVar1;
  u32 uVar2;
  char *pcVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  size_t sVar12;
  u8 uVar13;
  u8 eType;
  ulong uVar14;
  char *pcVar15;
  u32 uVar16;
  ulong uVar17;
  uint uVar18;
  char cVar19;
  long lVar20;
  uchar uVar21;
  u32 uVar22;
  ulong uVar23;
  uchar uVar24;
  uint uVar25;
  
  uVar17 = (ulong)i;
  pcVar3 = pParse->zJson;
LAB_001b9a6a:
  uVar25 = (uint)uVar17;
  __s1 = (byte *)(pcVar3 + uVar17);
  bVar6 = pcVar3[uVar17];
  if (bVar6 < 0x5d) {
    switch(bVar6) {
    case 0:
      return 0;
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x21:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x28:
    case 0x29:
    case 0x2a:
      break;
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      sVar12 = strspn(pcVar3 + (uVar25 + 1),"\t\n\r ");
      uVar17 = (ulong)(uVar25 + (int)sVar12 + 1);
      goto LAB_001b9a6a;
    case 0xb:
    case 0xc:
    case 0x2f:
switchD_001b9a91_caseD_b:
      iVar10 = json5Whitespace((char *)__s1);
      if (iVar10 != 0) goto code_r0x001b9ada;
      goto LAB_001ba1d3;
    case 0x22:
      goto switchD_001b9a91_caseD_22;
    case 0x27:
      pParse->hasNonstd = '\x01';
      bVar6 = *__s1;
switchD_001b9a91_caseD_22:
      uVar13 = '\a';
      uVar18 = uVar25 + 1;
      goto LAB_001b9fd6;
    case 0x2b:
      pParse->hasNonstd = '\x01';
      bVar6 = *__s1;
    case 0x2d:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      if ((char)bVar6 < '1') {
        uVar7 = uVar25 + 1;
        bVar5 = pcVar3[uVar7];
        uVar14 = (ulong)bVar5;
        if (bVar6 == 0x30) {
          if (((bVar5 | 0x20) == 0x78) &&
             (uVar23 = (ulong)(uVar25 + 2), (""[(byte)pcVar3[uVar23]] & 8) != 0)) {
            pParse->hasNonstd = '\x01';
            do {
              uVar7 = (int)uVar23 + 1;
              uVar23 = (ulong)uVar7;
            } while ((""[(byte)pcVar3[uVar23]] & 8) != 0);
LAB_001b9f68:
            bVar5 = 1;
            goto LAB_001b9f6a;
          }
          if (0xfffffffffffffff5 < uVar14 - 0x3a) goto LAB_001b9f44;
        }
        else {
          if (uVar14 - 0x3a < 0xfffffffffffffff6) {
            bVar6 = 1;
            if (uVar14 == 0x2e) goto LAB_001ba53d;
            if ((bVar5 == 0x69) || (bVar5 == 0x49)) {
              lVar11 = 0;
              goto LAB_001b9e12;
            }
            goto LAB_001ba1d3;
          }
          if (bVar5 == 0x30) {
            if (0xfffffffffffffff5 < (ulong)(byte)pcVar3[uVar25 + 2] - 0x3a) goto LAB_001b9f44;
            if (((byte)(pcVar3[uVar25 + 2] | 0x20U) == 0x78) &&
               (uVar14 = (ulong)(uVar25 + 3), (""[(byte)pcVar3[uVar14]] & 8) != 0)) {
              pParse->hasNonstd = '\x01';
              do {
                uVar7 = (int)uVar14 + 1;
                uVar14 = (ulong)uVar7;
              } while ((""[(byte)pcVar3[uVar14]] & 8) != 0);
              goto LAB_001b9f68;
            }
          }
        }
      }
      bVar6 = 0;
      goto LAB_001b9e85;
    case 0x2c:
      pParse->iErr = uVar25;
      return -4;
    case 0x2e:
      bVar6 = 3;
      if (0xfffffffffffffff5 < (ulong)(byte)pcVar3[uVar25 + 1] - 0x3a) goto LAB_001ba53d;
      goto LAB_001ba1d3;
    case 0x3a:
      pParse->iErr = uVar25;
      return -5;
    default:
      if (bVar6 == 0x5b) {
        uVar16 = pParse->nBlob;
        jsonBlobAppendNode(pParse,'\v',pParse->nJson - uVar25,(void *)0x0);
        if (pParse->oom != '\0') {
          return -1;
        }
        uVar2 = pParse->nBlob;
        uVar7 = *(int *)&pParse->iDepth + 1;
        pParse->iDepth = (u16)uVar7;
        if (1000 < (uVar7 & 0xffff)) {
          pParse->iErr = uVar25;
          return -1;
        }
        uVar25 = uVar25 + 1;
        uVar7 = jsonTranslateTextToBlob(pParse,uVar25);
        goto joined_r0x001ba5f1;
      }
    }
  }
  else if (bVar6 < 0x7b) {
    if (bVar6 < 0x6e) {
      if (bVar6 == 0x5d) {
        pParse->iErr = uVar25;
        return -3;
      }
      if (bVar6 == 0x66) {
        iVar10 = strncmp((char *)__s1,"false",5);
        if ((iVar10 == 0) && (uVar7 = uVar25 + 5, (""[(byte)pcVar3[uVar7]] & 6) == 0)) {
          uVar25 = pParse->nBlob;
          if (uVar25 < pParse->nBlobAlloc) {
            pParse->nBlob = uVar25 + 1;
            pParse->aBlob[uVar25] = '\x02';
            return uVar7;
          }
          uVar13 = '\x02';
          goto LAB_001ba6b9;
        }
        goto LAB_001ba1d3;
      }
    }
    else {
      if (bVar6 != 0x6e) {
        if (bVar6 != 0x74) goto switchD_001b9a91_caseD_1;
        iVar10 = strncmp((char *)__s1,"true",4);
        if ((iVar10 == 0) && (uVar7 = uVar25 + 4, (""[(byte)pcVar3[uVar7]] & 6) == 0)) {
          uVar25 = pParse->nBlob;
          if (uVar25 < pParse->nBlobAlloc) {
            pParse->nBlob = uVar25 + 1;
            pParse->aBlob[uVar25] = '\x01';
            return uVar7;
          }
          uVar13 = '\x01';
LAB_001ba6b9:
          jsonBlobExpandAndAppendOneByte(pParse,uVar13);
          return uVar7;
        }
        goto LAB_001ba1d3;
      }
      iVar10 = strncmp((char *)__s1,"null",4);
      if ((iVar10 == 0) && (uVar7 = uVar25 + 4, (""[(byte)pcVar3[uVar7]] & 6) == 0)) {
        uVar25 = pParse->nBlob;
        if (uVar25 < pParse->nBlobAlloc) {
          pParse->nBlob = uVar25 + 1;
          pParse->aBlob[uVar25] = '\0';
          return uVar7;
        }
        uVar13 = '\0';
        goto LAB_001ba6b9;
      }
    }
  }
  else {
    if ((bVar6 - 0xc2 < 0x2e) && ((0x200380000001U >> ((ulong)(bVar6 - 0xc2) & 0x3f) & 1) != 0))
    goto switchD_001b9a91_caseD_b;
    if (bVar6 == 0x7d) {
      pParse->iErr = uVar25;
      return -2;
    }
    if (bVar6 == 0x7b) {
      uVar16 = pParse->nBlob;
      jsonBlobAppendNode(pParse,'\f',pParse->nJson - uVar25,(void *)0x0);
      uVar7 = *(int *)&pParse->iDepth + 1;
      pParse->iDepth = (u16)uVar7;
      if (1000 < (uVar7 & 0xffff)) {
        pParse->iErr = uVar25;
        return -1;
      }
      uVar2 = pParse->nBlob;
      uVar22 = uVar2;
      goto LAB_001ba267;
    }
  }
switchD_001b9a91_caseD_1:
  lVar11 = 0;
  do {
    if (((bVar6 == aNanInfName[lVar11].c1) || (bVar6 == aNanInfName[lVar11].c2)) &&
       (pcVar15 = aNanInfName[lVar11].zMatch, pcVar15 != (char *)0x0)) {
      cVar19 = aNanInfName[lVar11].n;
      if ('\0' < cVar19) {
        uVar7 = (int)cVar19 + 1;
        lVar20 = 0;
        do {
          if ((ulong)(byte)pcVar3[lVar20 + uVar17] == 0) {
            uVar24 = ""[(byte)pcVar15[lVar20]];
            uVar21 = '\0';
LAB_001b9d50:
            if (uVar21 != uVar24) goto LAB_001b9d6c;
            break;
          }
          uVar21 = ""[(byte)pcVar3[lVar20 + uVar17]];
          uVar24 = ""[(byte)pcVar15[lVar20]];
          if (uVar21 != uVar24) goto LAB_001b9d50;
          uVar7 = uVar7 - 1;
          lVar20 = lVar20 + 1;
        } while (1 < uVar7);
      }
      uVar7 = (int)cVar19 + uVar25;
      if ((""[(byte)pcVar3[uVar7]] & 6) == 0) {
        if (aNanInfName[lVar11].eType == '\x05') {
          jsonBlobAppendNode(pParse,'\x05',5,"9e999");
        }
        else {
          uVar25 = pParse->nBlob;
          if (uVar25 < pParse->nBlobAlloc) {
            pParse->nBlob = uVar25 + 1;
            pParse->aBlob[uVar25] = '\0';
          }
          else {
            jsonBlobExpandAndAppendOneByte(pParse,'\0');
          }
        }
        pParse->hasNonstd = '\x01';
        return uVar7;
      }
    }
LAB_001b9d6c:
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  goto LAB_001ba1d3;
LAB_001ba267:
  uVar18 = (int)uVar17 + 1;
  uVar7 = jsonTranslateTextToBlob(pParse,uVar18);
  if (0 < (int)uVar7) goto LAB_001ba36a;
  if (uVar7 != 0xfffffffe) {
    iVar10 = json5Whitespace(pcVar3 + uVar18);
    uVar18 = uVar18 + iVar10;
    uVar14 = (ulong)uVar18;
    uVar13 = '\a';
    if ((""[(byte)pcVar3[uVar14]] & 0x42) != 0) {
LAB_001ba2da:
      pcVar15 = pcVar3 + uVar14;
LAB_001ba2ef:
      do {
        eType = uVar13;
        iVar8 = (int)uVar14;
        uVar25 = iVar8 + 1;
        uVar14 = (ulong)uVar25;
        bVar6 = pcVar3[(int)uVar25];
        if ((""[bVar6] & 0x46) != 0) {
          iVar9 = json5Whitespace(pcVar3 + (int)uVar25);
          uVar13 = eType;
          if (iVar9 == 0) goto LAB_001ba2ef;
        }
        if ((bVar6 != 0x5c) || (pcVar3[iVar8 + 2] != 'u')) goto LAB_001ba338;
        uVar14 = (ulong)(iVar8 + 1);
        iVar9 = jsonIs4Hex(pcVar3 + (long)(iVar8 + 2) + 1);
        uVar13 = '\b';
        if (iVar9 == 0) goto LAB_001ba338;
      } while( true );
    }
    if ((pcVar3[uVar14] == 0x5c) && (pcVar3[uVar18 + 1] == 'u')) {
      iVar8 = jsonIs4Hex(pcVar3 + (ulong)(uVar18 + 1) + 1);
      uVar13 = '\b';
      if (iVar8 != 0) goto LAB_001ba2da;
    }
    if (uVar7 != 0xffffffff) {
      pParse->iErr = uVar18;
      return -1;
    }
    return -1;
  }
  uVar25 = pParse->iErr;
  if (pParse->nBlob != uVar2) {
    pParse->hasNonstd = '\x01';
  }
  goto LAB_001ba76f;
LAB_001ba338:
  jsonBlobAppendNode(pParse,eType,iVar8 - (iVar10 + (int)uVar17),pcVar15);
  pParse->hasNonstd = '\x01';
  uVar7 = iVar8 + 1;
LAB_001ba36a:
  uVar17 = (ulong)uVar7;
  if (pParse->oom != '\0') {
    return -1;
  }
  if ((byte)((pParse->aBlob[uVar22] & 0xf) - 0xb) < 0xfc) goto switchD_001ba08a_caseD_6f;
  if ((ulong)(byte)pcVar3[uVar17] != 0x3a) {
    if (""[(byte)pcVar3[uVar17]] != '\0') {
      do {
        uVar7 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar7;
      } while (""[(byte)pcVar3[uVar17]] != '\0');
      if (pcVar3[uVar17] == 0x3a) goto LAB_001ba3e0;
    }
    iVar10 = jsonTranslateTextToBlob(pParse,uVar7);
    if (iVar10 != -5) {
      if (iVar10 != -1) {
        pParse->iErr = uVar7;
        return -1;
      }
      return -1;
    }
    uVar7 = pParse->iErr;
  }
LAB_001ba3e0:
  uVar7 = uVar7 + 1;
  uVar25 = jsonTranslateTextToBlob(pParse,uVar7);
  uVar17 = (ulong)uVar25;
  if ((int)uVar25 < 1) {
    if (uVar25 == 0xffffffff) {
      return -1;
    }
    goto LAB_001ba7c9;
  }
  bVar6 = pcVar3[uVar17];
  if (bVar6 != 0x2c) {
    if (bVar6 == 0x7d) goto LAB_001ba76f;
    if (""[bVar6] != '\0') {
      sVar12 = strspn(pcVar3 + uVar17 + 1,"\t\n\r ");
      uVar25 = uVar25 + (int)sVar12 + 1;
      uVar17 = (ulong)uVar25;
      if (pcVar3[uVar17] == ',') goto LAB_001ba46e;
      if (pcVar3[uVar17] == '}') goto LAB_001ba76f;
    }
    iVar10 = jsonTranslateTextToBlob(pParse,uVar25);
    if (iVar10 != -4) goto LAB_001ba71e;
    uVar17 = (ulong)pParse->iErr;
  }
LAB_001ba46e:
  uVar22 = pParse->nBlob;
  goto LAB_001ba267;
LAB_001ba71e:
  if (iVar10 == -2) {
    uVar25 = pParse->iErr;
LAB_001ba76f:
    jsonBlobChangePayloadSize(pParse,uVar16,pParse->nBlob - uVar2);
    pParse->iDepth = pParse->iDepth - 1;
    return uVar25 + 1;
  }
  goto LAB_001ba72e;
joined_r0x001ba5f1:
  if ((int)uVar7 < 1) goto LAB_001ba6d5;
  bVar6 = pcVar3[uVar7];
  if (bVar6 != 0x2c) {
    if (bVar6 == 0x5d) goto LAB_001ba7a7;
    if (""[bVar6] != '\0') {
      sVar12 = strspn(pcVar3 + (ulong)uVar7 + 1,"\t\n\r ");
      uVar7 = uVar7 + (int)sVar12 + 1;
      if (pcVar3[uVar7] == ',') goto LAB_001ba672;
      if (pcVar3[uVar7] == ']') goto LAB_001ba7a7;
    }
    iVar10 = jsonTranslateTextToBlob(pParse,uVar7);
    if (iVar10 != -4) {
      if (iVar10 != -3) {
LAB_001ba7c9:
        pParse->iErr = uVar7;
        return -1;
      }
      uVar7 = pParse->iErr;
      goto LAB_001ba7a7;
    }
    uVar7 = pParse->iErr;
  }
LAB_001ba672:
  uVar25 = uVar7 + 1;
  uVar7 = jsonTranslateTextToBlob(pParse,uVar25);
  goto joined_r0x001ba5f1;
LAB_001b9fd6:
  uVar17 = (ulong)uVar18;
  bVar5 = pcVar3[uVar17];
  while (uVar18 = (uint)uVar17, uVar7 = uVar18, ""[bVar5] != '\0') {
    uVar7 = uVar18 + 1;
    bVar5 = pcVar3[uVar7];
    if (""[bVar5] == '\0') break;
    uVar7 = uVar18 + 2;
    bVar5 = pcVar3[uVar7];
    if (""[bVar5] == '\0') break;
    uVar17 = (ulong)(uVar18 + 3);
    bVar5 = pcVar3[uVar17];
  }
  if (bVar5 == bVar6) {
    jsonBlobAppendNode(pParse,uVar13,~uVar25 + uVar7,pcVar3 + (uVar25 + 1));
    return uVar7 + 1;
  }
  if (bVar5 != 0x5c) {
    uVar18 = uVar7;
    if ((char)bVar5 < ' ') {
      if (bVar5 == 0) {
        pParse->iErr = uVar7;
        return -1;
      }
      pParse->hasNonstd = '\x01';
      uVar13 = '\t';
    }
    else if (bVar5 == 0x22) {
      uVar13 = '\t';
    }
    goto LAB_001ba18d;
  }
  uVar18 = uVar7 + 1;
  bVar5 = pcVar3[uVar18];
  if (bVar5 < 0x66) {
    if (bVar5 < 0x2f) {
      if (bVar5 < 0x22) {
        if (bVar5 == 10) goto switchD_001ba08a_caseD_76;
        if (bVar5 != 0xd) {
switchD_001ba08a_caseD_6f:
          pParse->iErr = uVar18;
          return -1;
        }
        if (pcVar3[uVar7 + 2] == '\n') {
          uVar18 = uVar7 + 2;
        }
      }
      else {
        if (bVar5 == 0x22) goto switchD_001ba08a_caseD_6e;
        if (bVar5 != 0x27) goto switchD_001ba08a_caseD_6f;
      }
switchD_001ba08a_caseD_76:
      pParse->hasNonstd = '\x01';
      uVar13 = '\t';
      goto LAB_001ba18d;
    }
    if (bVar5 < 0x5c) {
      if (bVar5 == 0x2f) goto switchD_001ba08a_caseD_6e;
      if (bVar5 == 0x30) goto switchD_001ba08a_caseD_76;
      goto switchD_001ba08a_caseD_6f;
    }
    if ((bVar5 != 0x5c) && (bVar5 != 0x62)) goto switchD_001ba08a_caseD_6f;
  }
  else {
    switch(bVar5) {
    case 0x6e:
    case 0x72:
    case 0x74:
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x77:
      goto switchD_001ba08a_caseD_6f;
    case 0x75:
      iVar10 = jsonIs4Hex(pcVar3 + (uVar7 + 2));
      if (iVar10 == 0) goto switchD_001ba08a_caseD_6f;
      break;
    case 0x76:
      goto switchD_001ba08a_caseD_76;
    case 0x78:
      if (((""[(byte)pcVar3[uVar7 + 2]] & 8) == 0) ||
         ((""[(byte)pcVar3[(ulong)(uVar7 + 2) + 1]] & 8) == 0)) goto switchD_001ba08a_caseD_6f;
      goto switchD_001ba08a_caseD_76;
    default:
      if (bVar5 != 0x66) goto switchD_001ba08a_caseD_6f;
    }
  }
switchD_001ba08a_caseD_6e:
  if (uVar13 == '\a') {
    uVar13 = '\b';
  }
LAB_001ba18d:
  uVar18 = uVar18 + 1;
  goto LAB_001b9fd6;
code_r0x001b9ada:
  pParse->hasNonstd = '\x01';
  uVar17 = (ulong)(iVar10 + uVar25);
  goto LAB_001b9a6a;
  while( true ) {
    uVar21 = ""[(byte)pcVar3[lVar11 + (ulong)uVar7]];
    uVar24 = ""[(byte)"inf"[lVar11]];
    if (uVar21 != uVar24) goto LAB_001ba4b7;
    lVar11 = lVar11 + 1;
    if (lVar11 == 3) break;
LAB_001b9e12:
    if ((ulong)(byte)pcVar3[lVar11 + (ulong)uVar7] == 0) {
      uVar24 = ""[(byte)"inf"[lVar11]];
      uVar21 = '\0';
LAB_001ba4b7:
      if (uVar21 != uVar24) {
        if (bVar5 != 0x2e) {
LAB_001ba1d3:
          pParse->iErr = uVar25;
          return -1;
        }
LAB_001ba53d:
        pParse->hasNonstd = '\x01';
LAB_001b9e85:
        bVar4 = true;
        do {
          bVar5 = bVar6;
          while( true ) {
            do {
              uVar14 = uVar17;
              iVar10 = (int)uVar14;
              uVar7 = iVar10 + 1;
              uVar17 = (ulong)uVar7;
              bVar1 = pcVar3[uVar17];
            } while (0xfffffffffffffff5 < (ulong)bVar1 - 0x3a);
            if (bVar1 != 0x2e) break;
            bVar1 = bVar5 & 2;
            bVar5 = bVar6 | 2;
            if (bVar1 != 0) goto LAB_001ba513;
          }
          cVar19 = pcVar3[uVar14];
          if ((bVar1 & 0xdf) != 0x45) {
            if (cVar19 < '0') {
              if (((cVar19 != '.') || (iVar10 - 1U < uVar25)) ||
                 ((ulong)(byte)pcVar3[iVar10 - 1U] - 0x3a < 0xfffffffffffffff6)) goto LAB_001ba513;
              pParse->hasNonstd = '\x01';
              bVar5 = bVar5 | 1;
            }
LAB_001b9f6a:
            uVar25 = uVar25 + (*__s1 == 0x2b);
            jsonBlobAppendNode(pParse,bVar5 + 3,uVar7 - uVar25,pcVar3 + uVar25);
            return uVar7;
          }
          if (cVar19 < '0') {
            if (((cVar19 != '.') || (iVar10 - 1U < uVar25)) ||
               ((ulong)(byte)pcVar3[iVar10 - 1U] - 0x3a < 0xfffffffffffffff6)) goto LAB_001ba513;
            pParse->hasNonstd = '\x01';
            bVar5 = bVar5 | 1;
          }
          if (!bVar4) {
LAB_001ba513:
            pParse->iErr = uVar7;
            return -1;
          }
          cVar19 = pcVar3[iVar10 + 2];
          if ((cVar19 == '-') || (cVar19 == '+')) {
            cVar19 = pcVar3[iVar10 + 3];
            uVar17 = (ulong)(iVar10 + 2);
          }
          uVar7 = (uint)uVar17;
          bVar6 = bVar5 | 2;
          bVar4 = false;
          if ((byte)(cVar19 - 0x3aU) < 0xf6) {
LAB_001b9f44:
            pParse->iErr = uVar7;
            return -1;
          }
        } while( true );
      }
      break;
    }
  }
  pParse->hasNonstd = '\x01';
  if (*__s1 == 0x2d) {
    pcVar15 = "-9e999";
    uVar16 = 6;
  }
  else {
    pcVar15 = "9e999";
    uVar16 = 5;
  }
  jsonBlobAppendNode(pParse,'\x05',uVar16,pcVar15);
  lVar11 = 0;
  do {
    if ((ulong)(byte)pcVar3[lVar11 + (ulong)(uVar25 + 4)] == 0) {
      uVar24 = ""[(byte)"RealAffinity"[lVar11 + 7]];
      uVar21 = '\0';
LAB_001ba5a4:
      iVar10 = 4;
      if (uVar21 != uVar24) goto LAB_001ba5b8;
      break;
    }
    uVar21 = ""[(byte)pcVar3[lVar11 + (ulong)(uVar25 + 4)]];
    uVar24 = ""[(byte)"RealAffinity"[lVar11 + 7]];
    if (uVar21 != uVar24) goto LAB_001ba5a4;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  iVar10 = 9;
LAB_001ba5b8:
  return iVar10 + uVar25;
LAB_001ba6d5:
  if (uVar7 == 0xffffffff) {
    return -1;
  }
  if (uVar7 == 0xfffffffd) {
    uVar7 = pParse->iErr;
    if (pParse->nBlob != uVar2) {
      pParse->hasNonstd = '\x01';
    }
LAB_001ba7a7:
    jsonBlobChangePayloadSize(pParse,uVar16,pParse->nBlob - uVar2);
    pParse->iDepth = pParse->iDepth - 1;
    return uVar7 + 1;
  }
LAB_001ba72e:
  pParse->iErr = uVar25;
  return -1;
}

Assistant:

static int jsonTranslateTextToBlob(JsonParse *pParse, u32 i){
  char c;
  u32 j;
  u32 iThis, iStart;
  int x;
  u8 t;
  const char *z = pParse->zJson;
json_parse_restart:
  switch( (u8)z[i] ){
  case '{': {
    /* Parse object */
    iThis = pParse->nBlob;
    jsonBlobAppendNode(pParse, JSONB_OBJECT, pParse->nJson-i, 0);
    if( ++pParse->iDepth > JSON_MAX_DEPTH ){
      pParse->iErr = i;
      return -1;
    }
    iStart = pParse->nBlob;
    for(j=i+1;;j++){
      u32 iBlob = pParse->nBlob;
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        int op;
        if( x==(-2) ){
          j = pParse->iErr;
          if( pParse->nBlob!=(u32)iStart ) pParse->hasNonstd = 1;
          break;
        }
        j += json5Whitespace(&z[j]);
        op = JSONB_TEXT;
        if( sqlite3JsonId1(z[j])
         || (z[j]=='\\' && jsonIs4HexB(&z[j+1], &op))
        ){
          int k = j+1;
          while( (sqlite3JsonId2(z[k]) && json5Whitespace(&z[k])==0)
            || (z[k]=='\\' && jsonIs4HexB(&z[k+1], &op))
          ){
            k++;
          }
          assert( iBlob==pParse->nBlob );
          jsonBlobAppendNode(pParse, op, k-j, &z[j]);
          pParse->hasNonstd = 1;
          x = k;
        }else{
          if( x!=-1 ) pParse->iErr = j;
          return -1;
        }
      }
      if( pParse->oom ) return -1;
      t = pParse->aBlob[iBlob] & 0x0f;
      if( t<JSONB_TEXT || t>JSONB_TEXTRAW ){
        pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==':' ){
        j++;
      }else{
        if( jsonIsspace(z[j]) ){
          /* strspn() is not helpful here */
          do{ j++; }while( jsonIsspace(z[j]) );
          if( z[j]==':' ){
            j++;
            goto parse_object_value;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x!=(-5) ){
          if( x!=(-1) ) pParse->iErr = j;
          return -1;
        }
        j = pParse->iErr+1;
      }
    parse_object_value:
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        if( x!=(-1) ) pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==',' ){
        continue;
      }else if( z[j]=='}' ){
        break;
      }else{
        if( jsonIsspace(z[j]) ){
          j += 1 + (u32)strspn(&z[j+1], jsonSpaces);
          if( z[j]==',' ){
            continue;
          }else if( z[j]=='}' ){
            break;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x==(-4) ){
          j = pParse->iErr;
          continue;
        }
        if( x==(-2) ){
          j = pParse->iErr;
          break;
        }
      }
      pParse->iErr = j;
      return -1;
    }
    jsonBlobChangePayloadSize(pParse, iThis, pParse->nBlob - iStart);
    pParse->iDepth--;
    return j+1;
  }
  case '[': {
    /* Parse array */
    iThis = pParse->nBlob;
    assert( i<=(u32)pParse->nJson );
    jsonBlobAppendNode(pParse, JSONB_ARRAY, pParse->nJson - i, 0);
    iStart = pParse->nBlob;
    if( pParse->oom ) return -1;
    if( ++pParse->iDepth > JSON_MAX_DEPTH ){
      pParse->iErr = i;
      return -1;
    }
    for(j=i+1;;j++){
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        if( x==(-3) ){
          j = pParse->iErr;
          if( pParse->nBlob!=iStart ) pParse->hasNonstd = 1;
          break;
        }
        if( x!=(-1) ) pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==',' ){
        continue;
      }else if( z[j]==']' ){
        break;
      }else{
        if( jsonIsspace(z[j]) ){
          j += 1 + (u32)strspn(&z[j+1], jsonSpaces);
          if( z[j]==',' ){
            continue;
          }else if( z[j]==']' ){
            break;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x==(-4) ){
          j = pParse->iErr;
          continue;
        }
        if( x==(-3) ){
          j = pParse->iErr;
          break;
        }
      }
      pParse->iErr = j;
      return -1;
    }
    jsonBlobChangePayloadSize(pParse, iThis, pParse->nBlob - iStart);
    pParse->iDepth--;
    return j+1;
  }
  case '\'': {
    u8 opcode;
    char cDelim;
    pParse->hasNonstd = 1;
    opcode = JSONB_TEXT;
    goto parse_string;
  case '"':
    /* Parse string */
    opcode = JSONB_TEXT;
  parse_string:
    cDelim = z[i];
    j = i+1;
    while( 1 /*exit-by-break*/ ){
      if( jsonIsOk[(u8)z[j]] ){
        if( !jsonIsOk[(u8)z[j+1]] ){
          j += 1;
        }else if( !jsonIsOk[(u8)z[j+2]] ){
          j += 2;
        }else{
          j += 3;
          continue;
        }
      }
      c = z[j];
      if( c==cDelim ){
        break;
      }else if( c=='\\' ){
        c = z[++j];
        if( c=='"' || c=='\\' || c=='/' || c=='b' || c=='f'
           || c=='n' || c=='r' || c=='t'
           || (c=='u' && jsonIs4Hex(&z[j+1])) ){
          if( opcode==JSONB_TEXT ) opcode = JSONB_TEXTJ;
        }else if( c=='\'' || c=='0' || c=='v' || c=='\n'
           || (0xe2==(u8)c && 0x80==(u8)z[j+1]
                && (0xa8==(u8)z[j+2] || 0xa9==(u8)z[j+2]))
           || (c=='x' && jsonIs2Hex(&z[j+1])) ){
          opcode = JSONB_TEXT5;
          pParse->hasNonstd = 1;
        }else if( c=='\r' ){
          if( z[j+1]=='\n' ) j++;
          opcode = JSONB_TEXT5;
          pParse->hasNonstd = 1;
        }else{
          pParse->iErr = j;
          return -1;
        }
      }else if( c<=0x1f ){
        if( c==0 ){
          pParse->iErr = j;
          return -1;
        }
        /* Control characters are not allowed in canonical JSON string
        ** literals, but are allowed in JSON5 string literals. */
        opcode = JSONB_TEXT5;
        pParse->hasNonstd = 1;
      }else if( c=='"' ){
        opcode = JSONB_TEXT5;
      }
      j++;
    }
    jsonBlobAppendNode(pParse, opcode, j-1-i, &z[i+1]);
    return j+1;
  }
  case 't': {
    if( strncmp(z+i,"true",4)==0 && !sqlite3Isalnum(z[i+4]) ){
      jsonBlobAppendOneByte(pParse, JSONB_TRUE);
      return i+4;
    }
    pParse->iErr = i;
    return -1;
  }
  case 'f': {
    if( strncmp(z+i,"false",5)==0 && !sqlite3Isalnum(z[i+5]) ){
      jsonBlobAppendOneByte(pParse, JSONB_FALSE);
      return i+5;
    }
    pParse->iErr = i;
    return -1;
  }
  case '+': {
    u8 seenE;
    pParse->hasNonstd = 1;
    t = 0x00;            /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
    goto parse_number;
  case '.':
    if( sqlite3Isdigit(z[i+1]) ){
      pParse->hasNonstd = 1;
      t = 0x03;          /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
      seenE = 0;
      goto parse_number_2;
    }
    pParse->iErr = i;
    return -1;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    /* Parse number */
    t = 0x00;            /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
  parse_number:
    seenE = 0;
    assert( '-' < '0' );
    assert( '+' < '0' );
    assert( '.' < '0' );
    c = z[i];

    if( c<='0' ){
      if( c=='0' ){
        if( (z[i+1]=='x' || z[i+1]=='X') && sqlite3Isxdigit(z[i+2]) ){
          assert( t==0x00 );
          pParse->hasNonstd = 1;
          t = 0x01;
          for(j=i+3; sqlite3Isxdigit(z[j]); j++){}
          goto parse_number_finish;
        }else if( sqlite3Isdigit(z[i+1]) ){
          pParse->iErr = i+1;
          return -1;
        }
      }else{
        if( !sqlite3Isdigit(z[i+1]) ){
          /* JSON5 allows for "+Infinity" and "-Infinity" using exactly
          ** that case.  SQLite also allows these in any case and it allows
          ** "+inf" and "-inf". */
          if( (z[i+1]=='I' || z[i+1]=='i')
           && sqlite3StrNICmp(&z[i+1], "inf",3)==0
          ){
            pParse->hasNonstd = 1;
            if( z[i]=='-' ){
              jsonBlobAppendNode(pParse, JSONB_FLOAT, 6, "-9e999");
            }else{
              jsonBlobAppendNode(pParse, JSONB_FLOAT, 5, "9e999");
            }
            return i + (sqlite3StrNICmp(&z[i+4],"inity",5)==0 ? 9 : 4);
          }
          if( z[i+1]=='.' ){
            pParse->hasNonstd = 1;
            t |= 0x01;
            goto parse_number_2;
          }
          pParse->iErr = i;
          return -1;
        }
        if( z[i+1]=='0' ){
          if( sqlite3Isdigit(z[i+2]) ){
            pParse->iErr = i+1;
            return -1;
          }else if( (z[i+2]=='x' || z[i+2]=='X') && sqlite3Isxdigit(z[i+3]) ){
            pParse->hasNonstd = 1;
            t |= 0x01;
            for(j=i+4; sqlite3Isxdigit(z[j]); j++){}
            goto parse_number_finish;
          }
        }
      }
    }

  parse_number_2:
    for(j=i+1;; j++){
      c = z[j];
      if( sqlite3Isdigit(c) ) continue;
      if( c=='.' ){
        if( (t & 0x02)!=0 ){
          pParse->iErr = j;
          return -1;
        }
        t |= 0x02;
        continue;
      }
      if( c=='e' || c=='E' ){
        if( z[j-1]<'0' ){
          if( ALWAYS(z[j-1]=='.') && ALWAYS(j-2>=i) && sqlite3Isdigit(z[j-2]) ){
            pParse->hasNonstd = 1;
            t |= 0x01;
          }else{
            pParse->iErr = j;
            return -1;
          }
        }
        if( seenE ){
          pParse->iErr = j;
          return -1;
        }
        t |= 0x02;
        seenE = 1;
        c = z[j+1];
        if( c=='+' || c=='-' ){
          j++;
          c = z[j+1];
        }
        if( c<'0' || c>'9' ){
          pParse->iErr = j;
          return -1;
        }
        continue;
      }
      break;
    }
    if( z[j-1]<'0' ){
      if( ALWAYS(z[j-1]=='.') && ALWAYS(j-2>=i) && sqlite3Isdigit(z[j-2]) ){
        pParse->hasNonstd = 1;
        t |= 0x01;
      }else{
        pParse->iErr = j;
        return -1;
      }
    }
  parse_number_finish:
    assert( JSONB_INT+0x01==JSONB_INT5 );
    assert( JSONB_FLOAT+0x01==JSONB_FLOAT5 );
    assert( JSONB_INT+0x02==JSONB_FLOAT );
    if( z[i]=='+' ) i++;
    jsonBlobAppendNode(pParse, JSONB_INT+t, j-i, &z[i]);
    return j;
  }
  case '}': {
    pParse->iErr = i;
    return -2;  /* End of {...} */
  }
  case ']': {
    pParse->iErr = i;
    return -3;  /* End of [...] */
  }
  case ',': {
    pParse->iErr = i;
    return -4;  /* List separator */
  }
  case ':': {
    pParse->iErr = i;
    return -5;  /* Object label/value separator */
  }
  case 0: {
    return 0;   /* End of file */
  }
  case 0x09:
  case 0x0a:
  case 0x0d:
  case 0x20: {
    i += 1 + (u32)strspn(&z[i+1], jsonSpaces);
    goto json_parse_restart;
  }
  case 0x0b:
  case 0x0c:
  case '/':
  case 0xc2:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xef: {
    j = json5Whitespace(&z[i]);
    if( j>0 ){
      i += j;
      pParse->hasNonstd = 1;
      goto json_parse_restart;
    }
    pParse->iErr = i;
    return -1;
  }
  case 'n': {
    if( strncmp(z+i,"null",4)==0 && !sqlite3Isalnum(z[i+4]) ){
      jsonBlobAppendOneByte(pParse, JSONB_NULL);
      return i+4;
    }
    /* fall-through into the default case that checks for NaN */
    /* no break */ deliberate_fall_through
  }
  default: {
    u32 k;
    int nn;
    c = z[i];
    for(k=0; k<sizeof(aNanInfName)/sizeof(aNanInfName[0]); k++){
      if( c!=aNanInfName[k].c1 && c!=aNanInfName[k].c2 ) continue;
      nn = aNanInfName[k].n;
      if( sqlite3StrNICmp(&z[i], aNanInfName[k].zMatch, nn)!=0 ){
        continue;
      }
      if( sqlite3Isalnum(z[i+nn]) ) continue;
      if( aNanInfName[k].eType==JSONB_FLOAT ){
        jsonBlobAppendNode(pParse, JSONB_FLOAT, 5, "9e999");
      }else{
        jsonBlobAppendOneByte(pParse, JSONB_NULL);
      }
      pParse->hasNonstd = 1;
      return i + nn;
    }
    pParse->iErr = i;
    return -1;  /* Syntax error */
  }
  } /* End switch(z[i]) */
}